

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O3

ssize_t __thiscall
booster::aio::stream_socket::writev(stream_socket *this,int __fd,iovec *__iovec,int __count)

{
  native_type __fd_00;
  int *piVar1;
  ulong uVar2;
  int *piVar3;
  long lVar4;
  undefined4 in_register_00000034;
  int __count_00;
  iovec vec [16];
  iovec local_128 [16];
  
  piVar3 = (int *)CONCAT44(in_register_00000034,__fd);
  if (*piVar3 == 1) {
    piVar1 = piVar3 + 2;
    lVar4 = 1;
LAB_00165cc6:
    uVar2 = 0xf;
    if (lVar4 - 1U < 0xf) {
      uVar2 = lVar4 - 1U;
    }
    lVar4 = 0;
    do {
      *(undefined8 *)((long)&local_128[0].iov_base + lVar4) = *(undefined8 *)((long)piVar1 + lVar4);
      *(undefined8 *)((long)&local_128[0].iov_len + lVar4) =
           *(undefined8 *)((long)piVar1 + lVar4 + 8);
      lVar4 = lVar4 + 0x10;
    } while ((ulong)(uint)((int)uVar2 << 4) + 0x10 != lVar4);
    __count_00 = (int)uVar2 + 1;
  }
  else {
    if (*piVar3 != 0) {
      piVar1 = *(int **)(piVar3 + 6);
      if (*(long *)(piVar3 + 8) - (long)piVar1 != 0) {
        lVar4 = *(long *)(piVar3 + 8) - (long)piVar1 >> 4;
        goto LAB_00165cc6;
      }
    }
    __count_00 = 0;
  }
  do {
    __fd_00 = basic_io_device::native((basic_io_device *)this);
    uVar2 = ::writev(__fd_00,local_128,__count_00);
    if (-1 < (int)uVar2) break;
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  return uVar2 & 0xffffffff;
}

Assistant:

int stream_socket::writev(const_buffer const &b)
{
	static const unsigned max_vec_size = 16;
	const_buffer::buffer_data_type data = b.get();
	unsigned size=0;
#ifndef BOOSTER_WIN32
	struct iovec vec[max_vec_size];
	for(;size < max_vec_size && size < data.second;size++) {
		vec[size].iov_base = const_cast<char *>(data.first[size].ptr);
		vec[size].iov_len = data.first[size].size;
	}
	for(;;) {
		int ret = ::writev(native(),vec,size);
		if(ret >= 0)
			return ret;
		if(ret < 0 && errno==EINTR)
			continue;
		return ret;
	}
#else // Win32
	WSABUF vec[max_vec_size];
	for(;size < max_vec_size && size < data.second;size++) {
		vec[size].buf = const_cast<char *>(data.first[size].ptr);
		vec[size].len = data.first[size].size;
	}
	DWORD send=0;
	int res = ::WSASend(native(),vec,size,&send,0,0,0);
	if(res == 0)
		return send;
	return -1;
#endif
}